

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

void bifdef(bifcxdef *ctx,int argc)

{
  objnum obj;
  prpnum prop;
  undefined4 uVar1;
  runsdef *prVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  runcxdef *prVar6;
  bool bVar7;
  objnum def_objn;
  runsdef val;
  objnum local_2a;
  runsdef local_28;
  
  prVar2 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar2 + -1;
  prVar6 = ctx->bifcxrun;
  if (prVar2[-1].runstyp != '\x02') {
    prVar6->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3f2);
  }
  prVar2 = prVar6->runcxsp;
  obj = (prVar2->runsv).runsvobj;
  prVar6->runcxsp = prVar2 + -1;
  prVar6 = ctx->bifcxrun;
  if (prVar2[-1].runstyp != '\r') {
    prVar6->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3f4);
  }
  prVar2 = prVar6->runcxsp;
  prop = (prVar2->runsv).runsvprp;
  if (argc == 3) {
    prVar6->runcxsp = prVar2 + -1;
    prVar6 = ctx->bifcxrun;
    if (prVar2[-1].runstyp != '\x01') {
      prVar6->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3eb);
    }
    uVar1 = *(undefined4 *)&prVar6->runcxsp->runsv;
    uVar3 = objgetap(prVar6->runcxmem,obj,prop,&local_2a,0);
    switch(uVar1) {
    case 1:
      goto switchD_0020f9f3_caseD_1;
    case 2:
      prVar6 = ctx->bifcxrun;
      bVar7 = local_2a == obj;
      break;
    case 3:
      prVar6 = ctx->bifcxrun;
      bVar7 = local_2a != obj;
      break;
    case 4:
      if (uVar3 != 0) {
        runpobj(ctx->bifcxrun,local_2a);
        return;
      }
      runpnil(ctx->bifcxrun);
      return;
    default:
      ctx->bifcxrun->runcxerr->errcxptr->erraav[0].errastr = "defined";
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
      runsign(ctx->bifcxrun,0x400);
    }
    bVar4 = bVar7 & uVar3 != 0;
    iVar5 = (uint)bVar4 + (uint)bVar4 * 2;
  }
  else {
    uVar3 = objgetap(prVar6->runcxmem,obj,prop,&local_2a,0);
switchD_0020f9f3_caseD_1:
    prVar6 = ctx->bifcxrun;
    iVar5 = (uint)(uVar3 != 0) * 3;
  }
  runpush(prVar6,iVar5 + 5,&local_28);
  return;
}

Assistant:

void bifdef(bifcxdef *ctx, int argc)
{
    prpnum  prpn;
    objnum  objn;
    uint    ofs;
    runsdef val;
    objnum  def_objn;
    int     flag;

    /* get object and property arguments */
    objn = runpopobj(ctx->bifcxrun);
    prpn = runpopprp(ctx->bifcxrun);

    /* if there's a flag argument, get it as well */
    if (argc == 3)
    {
        /* get the flag */
        flag = (int)runpopnum(ctx->bifcxrun);
    }
    else
    {
        /* check the argument count */
        bifcntargs(ctx, 2, argc);

        /* use the default flag value (DEFINES_OR_INHERITS) */
        flag = BIFDEF_DEFINED_ANY;
    }

    /* get the offset of the property and the defining object */
    ofs = objgetap(ctx->bifcxrun->runcxmem, objn, prpn, &def_objn, FALSE);

    /* determine the type of information they want */
    switch(flag)
    {
    case BIFDEF_DEFINED_ANY:
        /* if the property is defined, return true, else return nil */
        runpush(ctx->bifcxrun, runclog(ofs != 0), &val);
        break;

    case BIFDEF_DEFINED_DIRECTLY:
        /* if the property is defined directly by the object, return true */
        runpush(ctx->bifcxrun, runclog(ofs != 0 && def_objn == objn), &val);
        break;
        
    case BIFDEF_DEFINED_INHERITS:
        /* if the property is inherited, return true */
        runpush(ctx->bifcxrun, runclog(ofs != 0 && def_objn != objn), &val);
        break;

    case BIFDEF_DEFINED_GET_CLASS:
        /* if it's defined, return the defining object, otherwise nil */
        if (ofs == 0)
            runpnil(ctx->bifcxrun);
        else
            runpobj(ctx->bifcxrun, def_objn);
        break;

    default:
        /* invalid flag value */
        runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "defined");
    }
}